

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PretransformVertices.cpp
# Opt level: O2

void __thiscall
Assimp::PretransformVertices::BuildWCSMeshes
          (PretransformVertices *this,vector<aiMesh_*,_std::allocator<aiMesh_*>_> *out,aiMesh **in,
          uint numIn,aiNode *node)

{
  aiMatrix4x4 *m;
  aiMesh *src;
  pointer ppaVar1;
  aiMesh *paVar2;
  PretransformVertices *this_00;
  aiMesh **in_00;
  bool bVar3;
  Logger *this_01;
  uint i;
  uint uVar4;
  ulong uVar5;
  aiMesh *ntz;
  aiMesh *local_48;
  PretransformVertices *local_40;
  aiMesh **local_38;
  
  m = &node->mTransformation;
  uVar5 = 0;
  local_40 = this;
  local_38 = in;
  do {
    in_00 = local_38;
    this_00 = local_40;
    if (node->mNumMeshes <= uVar5) {
      for (uVar5 = 0; uVar5 < node->mNumChildren; uVar5 = uVar5 + 1) {
        BuildWCSMeshes(this_00,out,in_00,numIn,node->mChildren[uVar5]);
      }
      return;
    }
    src = local_38[node->mMeshes[uVar5]];
    if ((aiMatrix4x4t<float> *)src->mBones == (aiMatrix4x4t<float> *)0x0) {
LAB_00143f47:
      src->mBones = (aiBone **)m;
      src->mNumBones = 0xffffffff;
    }
    else {
      bVar3 = aiMatrix4x4t<float>::operator==((aiMatrix4x4t<float> *)src->mBones,m);
      if (bVar3) goto LAB_00143f47;
      uVar4 = 0;
      while( true ) {
        ppaVar1 = (out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>)._M_impl.
                          super__Vector_impl_data._M_finish - (long)ppaVar1 >> 3) <= (ulong)uVar4)
        break;
        paVar2 = ppaVar1[uVar4];
        if (paVar2->mNumBones == node->mMeshes[uVar5]) {
          bVar3 = aiMatrix4x4t<float>::operator==((aiMatrix4x4t<float> *)paVar2->mBones,m);
          if (bVar3) {
            node->mMeshes[uVar5] = numIn + uVar4;
          }
        }
        uVar4 = uVar4 + 1;
      }
      if (node->mMeshes[uVar5] < numIn) {
        this_01 = DefaultLogger::get();
        Logger::info(this_01,"PretransformVertices: Copying mesh due to mismatching transforms");
        uVar4 = src->mNumBones;
        src->mNumBones = 0;
        SceneCombiner::Copy(&local_48,src);
        src->mNumBones = uVar4;
        local_48->mNumBones = node->mMeshes[uVar5];
        local_48->mBones = (aiBone **)m;
        std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(out,&local_48);
        node->mMeshes[uVar5] =
             (int)((ulong)((long)(out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)(out->super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>).
                                _M_impl.super__Vector_impl_data._M_start) >> 3) + (numIn - 1);
      }
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

void PretransformVertices::BuildWCSMeshes(std::vector<aiMesh*>& out, aiMesh** in,
    unsigned int numIn, aiNode* node)
{
    // NOTE:
    //  aiMesh::mNumBones store original source mesh, or UINT_MAX if not a copy
    //  aiMesh::mBones store reference to abs. transform we multiplied with

    // process meshes
    for (unsigned int i = 0; i < node->mNumMeshes;++i) {
        aiMesh* mesh = in[node->mMeshes[i]];

        // check whether we can operate on this mesh
        if (!mesh->mBones || *reinterpret_cast<aiMatrix4x4*>(mesh->mBones) == node->mTransformation) {
            // yes, we can.
            mesh->mBones = reinterpret_cast<aiBone**> (&node->mTransformation);
            mesh->mNumBones = UINT_MAX;
        }
        else {

            // try to find us in the list of newly created meshes
            for (unsigned int n = 0; n < out.size(); ++n) {
                aiMesh* ctz = out[n];
                if (ctz->mNumBones == node->mMeshes[i] && *reinterpret_cast<aiMatrix4x4*>(ctz->mBones) ==  node->mTransformation) {

                    // ok, use this one. Update node mesh index
                    node->mMeshes[i] = numIn + n;
                }
            }
            if (node->mMeshes[i] < numIn) {
                // Worst case. Need to operate on a full copy of the mesh
                ASSIMP_LOG_INFO("PretransformVertices: Copying mesh due to mismatching transforms");
                aiMesh* ntz;

                const unsigned int tmp = mesh->mNumBones; //
                mesh->mNumBones = 0;
                SceneCombiner::Copy(&ntz,mesh);
                mesh->mNumBones = tmp;

                ntz->mNumBones = node->mMeshes[i];
                ntz->mBones = reinterpret_cast<aiBone**> (&node->mTransformation);

                out.push_back(ntz);

                node->mMeshes[i] = static_cast<unsigned int>(numIn + out.size() - 1);
            }
        }
    }

    // call children
    for (unsigned int i = 0; i < node->mNumChildren;++i)
        BuildWCSMeshes(out,in,numIn,node->mChildren[i]);
}